

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_encrypt.c
# Opt level: O0

int main(int argc,char **argv)

{
  size_t sVar1;
  FILE *__stream;
  char *pcVar2;
  char *pers;
  uchar buf [512];
  uchar input [1024];
  undefined1 local_5a0 [8];
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_entropy_context entropy;
  mbedtls_pk_context pk;
  size_t olen;
  size_t i;
  int ret;
  FILE *f;
  char **argv_local;
  int argc_local;
  
  pk.pk_ctx = (void *)0x0;
  i._4_4_ = 1;
  mbedtls_ctr_drbg_init((mbedtls_ctr_drbg_context *)local_5a0);
  if (argc == 3) {
    printf("\n  . Seeding the random number generator...");
    fflush(_stdout);
    mbedtls_entropy_init((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
    sVar1 = strlen("mbedtls_pk_encrypt");
    i._4_4_ = mbedtls_ctr_drbg_seed
                        ((mbedtls_ctr_drbg_context *)local_5a0,mbedtls_entropy_func,
                         &ctr_drbg.p_entropy,(uchar *)"mbedtls_pk_encrypt",sVar1);
    if (i._4_4_ == 0) {
      printf("\n  . Reading public key from \'%s\'",argv[1]);
      fflush(_stdout);
      mbedtls_pk_init((mbedtls_pk_context *)&entropy.source[0x13].strong);
      i._4_4_ = mbedtls_pk_parse_public_keyfile
                          ((mbedtls_pk_context *)&entropy.source[0x13].strong,argv[1]);
      if (i._4_4_ == 0) {
        sVar1 = strlen(argv[2]);
        if (sVar1 < 0x65) {
          pcVar2 = argv[2];
          sVar1 = strlen(argv[2]);
          memcpy(buf + 0x1f8,pcVar2,sVar1);
          printf("\n  . Generating the encrypted value");
          fflush(_stdout);
          sVar1 = strlen(argv[2]);
          i._4_4_ = mbedtls_pk_encrypt((mbedtls_pk_context *)&entropy.source[0x13].strong,
                                       buf + 0x1f8,sVar1,(uchar *)&pers,(size_t *)&pk.pk_ctx,0x200,
                                       mbedtls_ctr_drbg_random,local_5a0);
          if (i._4_4_ == 0) {
            __stream = fopen("result-enc.txt","wb+");
            if (__stream == (FILE *)0x0) {
              i._4_4_ = 1;
              printf(" failed\n  ! Could not create %s\n\n","result-enc.txt");
            }
            else {
              for (olen = 0; olen < pk.pk_ctx; olen = olen + 1) {
                pcVar2 = " ";
                if ((olen + 1 & 0xf) == 0) {
                  pcVar2 = "\r\n";
                }
                fprintf(__stream,"%02X%s",(ulong)buf[olen - 8],pcVar2);
              }
              fclose(__stream);
              printf("\n  . Done (created \"%s\")\n\n","result-enc.txt");
            }
          }
          else {
            printf(" failed\n  ! mbedtls_pk_encrypt returned -0x%04x\n",(ulong)(uint)-i._4_4_);
          }
        }
        else {
          printf(" Input data larger than 100 characters.\n\n");
        }
      }
      else {
        printf(" failed\n  ! mbedtls_pk_parse_public_keyfile returned -0x%04x\n",
               (ulong)(uint)-i._4_4_);
      }
    }
    else {
      printf(" failed\n  ! mbedtls_ctr_drbg_seed returned -0x%04x\n",(ulong)(uint)-i._4_4_);
    }
  }
  else {
    printf("usage: mbedtls_pk_encrypt <key_file> <string of max 100 characters>\n");
  }
  mbedtls_ctr_drbg_free((mbedtls_ctr_drbg_context *)local_5a0);
  mbedtls_entropy_free((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  if (i._4_4_ != 0) {
    mbedtls_strerror(i._4_4_,(char *)&pers,0x200);
    printf("  !  Last error was: %s\n",&pers);
  }
  return i._4_4_;
}

Assistant:

int main( int argc, char *argv[] )
{
    FILE *f;
    int ret;
    size_t i, olen = 0;
    mbedtls_pk_context pk;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    unsigned char input[1024];
    unsigned char buf[512];
    const char *pers = "mbedtls_pk_encrypt";

    ret = 1;
    mbedtls_ctr_drbg_init( &ctr_drbg );

    if( argc != 3 )
    {
        mbedtls_printf( "usage: mbedtls_pk_encrypt <key_file> <string of max 100 characters>\n" );

#if defined(_WIN32)
        mbedtls_printf( "\n" );
#endif

        goto exit;
    }

    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    mbedtls_entropy_init( &entropy );
    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned -0x%04x\n", -ret );
        goto exit;
    }

    mbedtls_printf( "\n  . Reading public key from '%s'", argv[1] );
    fflush( stdout );

    mbedtls_pk_init( &pk );

    if( ( ret = mbedtls_pk_parse_public_keyfile( &pk, argv[1] ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_pk_parse_public_keyfile returned -0x%04x\n", -ret );
        goto exit;
    }

    if( strlen( argv[2] ) > 100 )
    {
        mbedtls_printf( " Input data larger than 100 characters.\n\n" );
        goto exit;
    }

    memcpy( input, argv[2], strlen( argv[2] ) );

    /*
     * Calculate the RSA encryption of the hash.
     */
    mbedtls_printf( "\n  . Generating the encrypted value" );
    fflush( stdout );

    if( ( ret = mbedtls_pk_encrypt( &pk, input, strlen( argv[2] ),
                            buf, &olen, sizeof(buf),
                            mbedtls_ctr_drbg_random, &ctr_drbg ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_pk_encrypt returned -0x%04x\n", -ret );
        goto exit;
    }

    /*
     * Write the signature into result-enc.txt
     */
    if( ( f = fopen( "result-enc.txt", "wb+" ) ) == NULL )
    {
        ret = 1;
        mbedtls_printf( " failed\n  ! Could not create %s\n\n", "result-enc.txt" );
        goto exit;
    }

    for( i = 0; i < olen; i++ )
        mbedtls_fprintf( f, "%02X%s", buf[i],
                 ( i + 1 ) % 16 == 0 ? "\r\n" : " " );

    fclose( f );

    mbedtls_printf( "\n  . Done (created \"%s\")\n\n", "result-enc.txt" );

exit:
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(MBEDTLS_ERROR_C)
    if( ret != 0 )
    {
        mbedtls_strerror( ret, (char *) buf, sizeof(buf) );
        mbedtls_printf( "  !  Last error was: %s\n", buf );
    }
#endif

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret );
}